

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Table.cpp
# Opt level: O0

bool __thiscall luna::Table::FirstKeyValue(Table *this,Value *key,Value *value)

{
  bool bVar1;
  size_t sVar2;
  type this_00;
  reference pvVar3;
  pointer ppVar4;
  anon_union_8_9_8deb4486_for_Value_0 *in_RDX;
  anon_union_8_9_8deb4486_for_Value_0 *in_RSI;
  Table *in_RDI;
  iterator first;
  unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>
  *in_stack_ffffffffffffffc8;
  bool local_1;
  
  sVar2 = ArraySize(in_RDI);
  if (sVar2 == 0) {
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
                        *)0x1f64ab);
    if (bVar1) {
      std::
      unique_ptr<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
      ::operator->((unique_ptr<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
                    *)0x1f64bf);
      bVar1 = std::
              unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>
              ::empty((unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>
                       *)0x1f64c7);
      if (!bVar1) {
        std::
        unique_ptr<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
        ::operator->((unique_ptr<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
                      *)0x1f64d9);
        std::
        unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>
        ::begin(in_stack_ffffffffffffffc8);
        ppVar4 = std::__detail::
                 _Node_iterator<std::pair<const_luna::Value,_luna::Value>,_false,_true>::operator->
                           ((_Node_iterator<std::pair<const_luna::Value,_luna::Value>,_false,_true>
                             *)0x1f64f0);
        *in_RSI = (ppVar4->first).field_0;
        *(ValueT *)(in_RSI + 1) = (ppVar4->first).type_;
        ppVar4 = std::__detail::
                 _Node_iterator<std::pair<const_luna::Value,_luna::Value>,_false,_true>::operator->
                           ((_Node_iterator<std::pair<const_luna::Value,_luna::Value>,_false,_true>
                             *)0x1f650e);
        *in_RDX = (ppVar4->second).field_0;
        *(ValueT *)(in_RDX + 1) = (ppVar4->second).type_;
        return true;
      }
    }
    local_1 = false;
  }
  else {
    in_RSI->num_ = 1.0;
    *(undefined4 *)(in_RSI + 1) = 2;
    this_00 = std::
              unique_ptr<std::vector<luna::Value,_std::allocator<luna::Value>_>,_std::default_delete<std::vector<luna::Value,_std::allocator<luna::Value>_>_>_>
              ::operator*((unique_ptr<std::vector<luna::Value,_std::allocator<luna::Value>_>,_std::default_delete<std::vector<luna::Value,_std::allocator<luna::Value>_>_>_>
                           *)in_RDI);
    pvVar3 = std::vector<luna::Value,_std::allocator<luna::Value>_>::operator[](this_00,0);
    *in_RDX = pvVar3->field_0;
    *(ValueT *)(in_RDX + 1) = pvVar3->type_;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool Table::FirstKeyValue(Value &key, Value &value)
    {
        // array part
        if (ArraySize() > 0)
        {
            key.num_ = 1;           // first element index
            key.type_ = ValueT_Number;
            value = (*array_)[0];
            return true;
        }

        // hash part
        if (hash_ && !hash_->empty())
        {
            auto first = hash_->begin();
            key = first->first;
            value = first->second;
            return true;
        }

        return false;
    }